

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

tuple __thiscall
pybind11::
make_tuple<(pybind11::return_value_policy)1,pybind11::handle,pybind11::handle,pybind11::none,pybind11::str>
          (pybind11 *this,handle *args_,handle *args__1,none *args__2,str *args__3)

{
  PyObject *pPVar1;
  undefined8 uVar2;
  handle *phVar3;
  runtime_error *this_00;
  long *plVar4;
  long *plVar5;
  long lVar6;
  undefined1 local_108 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  argtypes;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  handle local_48;
  array<pybind11::object,_4UL> args;
  
  pPVar1 = args_->m_ptr;
  if (pPVar1 != (PyObject *)0x0) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  local_48.m_ptr = args_->m_ptr;
  pPVar1 = args__1->m_ptr;
  if (pPVar1 != (PyObject *)0x0) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  args._M_elems[0].super_handle.m_ptr = (handle)(handle)args__1->m_ptr;
  pPVar1 = (args__2->super_object).super_handle.m_ptr;
  if (pPVar1 != (PyObject *)0x0) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  args._M_elems[1].super_handle.m_ptr = (handle)(handle)(args__2->super_object).super_handle.m_ptr;
  pPVar1 = (args__3->super_object).super_handle.m_ptr;
  if (pPVar1 != (PyObject *)0x0) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  phVar3 = &local_48;
  args._M_elems[2].super_handle.m_ptr = (handle)(handle)(args__3->super_object).super_handle.m_ptr;
  lVar6 = 0;
  do {
    if (phVar3->m_ptr == (PyObject *)0x0) {
      type_id<pybind11::handle>();
      type_id<pybind11::handle>();
      type_id<pybind11::none>();
      type_id<pybind11::str>();
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&argtypes._M_elems[3].field_2 + 8),
                     "make_tuple(): unable to convert argument of type \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_108 + -lVar6));
      plVar4 = (long *)std::__cxx11::string::append(argtypes._M_elems[3].field_2._M_local_buf + 8);
      local_68 = (long *)*plVar4;
      plVar5 = plVar4 + 2;
      if (local_68 == plVar5) {
        local_58 = *plVar5;
        lStack_50 = plVar4[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar5;
      }
      local_60 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::runtime_error::runtime_error(this_00,(string *)&local_68);
      *(undefined ***)this_00 = &PTR__runtime_error_00120a48;
      __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar6 = lVar6 + -0x20;
    phVar3 = phVar3 + 1;
  } while (lVar6 != -0x80);
  tuple::tuple((tuple *)this,4);
  lVar6 = 0;
  do {
    uVar2 = *(undefined8 *)((long)(args._M_elems + -1) + lVar6);
    *(undefined8 *)((long)(args._M_elems + -1) + lVar6) = 0;
    if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) == 0) {
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CRPropa[P]sophia_next/lib/pybind11/include/pybind11/cast.h"
                    ,0x722,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <pybind11::handle, pybind11::handle, pybind11::none, pybind11::str>]"
                   );
    }
    *(undefined8 *)(*(long *)this + 0x18 + lVar6) = uVar2;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  lVar6 = 0x18;
  do {
    object::~object((object *)((long)(args._M_elems + -1) + lVar6));
    lVar6 = lVar6 + -8;
  } while (lVar6 != -8);
  return (object)(object)this;
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}